

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

Sprite * __thiscall olc::Sprite::Duplicate(Sprite *this,vi2d *vPos,vi2d *vSize)

{
  Pixel p;
  Sprite *this_00;
  int local_3c;
  int local_38;
  int x;
  int y;
  Sprite *spr;
  vi2d *vSize_local;
  vi2d *vPos_local;
  Sprite *this_local;
  
  this_00 = (Sprite *)operator_new(0x28);
  Sprite(this_00,vSize->x,vSize->y);
  for (local_38 = 0; local_38 < vSize->y; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < vSize->x; local_3c = local_3c + 1) {
      p = GetPixel(this,vPos->x + local_3c,vPos->y + local_38);
      SetPixel(this_00,local_3c,local_38,p);
    }
  }
  return this_00;
}

Assistant:

olc::Sprite* Sprite::Duplicate(const olc::vi2d& vPos, const olc::vi2d& vSize)
	{
		olc::Sprite* spr = new olc::Sprite(vSize.x, vSize.y);
		for (int y = 0; y < vSize.y; y++)
			for (int x = 0; x < vSize.x; x++)
				spr->SetPixel(x, y, GetPixel(vPos.x + x, vPos.y + y));
		return spr;
	}